

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::CompilerGLSL::expression_read_implies_multiple_reads
          (CompilerGLSL *this,uint32_t id)

{
  SPIRExpression *pSVar1;
  SPIRExpression *expr;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  pSVar1 = Compiler::maybe_get<diligent_spirv_cross::SPIRExpression>(&this->super_Compiler,id);
  if (pSVar1 == (SPIRExpression *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = pSVar1->emitted_loop_level < (this->super_Compiler).current_loop_level;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::expression_read_implies_multiple_reads(uint32_t id) const
{
	auto *expr = maybe_get<SPIRExpression>(id);
	if (!expr)
		return false;

	// If we're emitting code at a deeper loop level than when we emitted the expression,
	// we're probably reading the same expression over and over.
	return current_loop_level > expr->emitted_loop_level;
}